

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *
tinyusdz::lerp<tinyusdz::value::color4h>
          (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *a,
          vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *b,double t)

{
  pointer pcVar1;
  ulong uVar2;
  color4h cVar3;
  long lVar4;
  ulong __new_size;
  color4h local_40;
  color4h local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = (long)(a->
                super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  __new_size = (long)(b->
                     super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(b->
                     super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar2 <= __new_size) {
    __new_size = uVar2;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      lVar4 = 0;
      do {
        pcVar1 = (b->
                 super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_38 = operator*((float)(1.0 - t),
                             (color4h *)
                             ((long)&(((a->
                                       super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->r).value + lVar4
                             ));
        local_40 = operator*((float)t,(color4h *)((long)&(pcVar1->r).value + lVar4));
        cVar3 = operator+(&local_38,&local_40);
        *(color4h *)
         ((long)&(((__return_storage_ptr__->
                   super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                   )._M_impl.super__Vector_impl_data._M_start)->r).value + lVar4) = cVar3;
        lVar4 = lVar4 + 8;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}